

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prov_custom_hsm.c
# Opt level: O0

char * prov_custom_hsm_get_common_name(HSM_CLIENT_HANDLE handle)

{
  size_t sVar1;
  size_t len;
  CUSTOM_HSM_SAMPLE_INFO *hsm_info;
  char *result;
  HSM_CLIENT_HANDLE handle_local;
  
  if (handle == (HSM_CLIENT_HANDLE)0x0) {
    printf("Invalid handle value specified\r\n");
    hsm_info = (CUSTOM_HSM_SAMPLE_INFO *)0x0;
  }
  else {
    sVar1 = strlen(*(char **)((long)handle + 8));
    hsm_info = (CUSTOM_HSM_SAMPLE_INFO *)malloc(sVar1 + 1);
    if (hsm_info == (CUSTOM_HSM_SAMPLE_INFO *)0x0) {
      printf("Failure allocating certificate\r\n");
      hsm_info = (CUSTOM_HSM_SAMPLE_INFO *)0x0;
    }
    else {
      strcpy((char *)hsm_info,*(char **)((long)handle + 8));
    }
  }
  return (char *)hsm_info;
}

Assistant:

char* prov_custom_hsm_get_common_name(HSM_CLIENT_HANDLE handle)
{
    char* result;
    if (handle == NULL)
    {
        (void)printf("Invalid handle value specified\r\n");
        result = NULL;
    }
    else
    {
        // TODO: Malloc the common name for the iothub sdk to free
        // this value will be sent to dps
        CUSTOM_HSM_SAMPLE_INFO* hsm_info = (CUSTOM_HSM_SAMPLE_INFO*)handle;
        size_t len = strlen(hsm_info->common_name);
        if ((result = (char*)malloc(len + 1)) == NULL)
        {
            (void)printf("Failure allocating certificate\r\n");
            result = NULL;
        }
        else
        {
            strcpy(result, hsm_info->common_name);
        }
    }
    return result;
}